

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

LengthList * lunasvg::parseDashArray(LengthList *__return_storage_ptr__,string_view input)

{
  Length LVar1;
  bool bVar2;
  int iVar3;
  Length LVar4;
  const_reference pvVar5;
  basic_string_view<char,_std::char_traits<char>_> input_00;
  byte local_81;
  Length local_48;
  Length value;
  size_t count;
  LengthList values;
  string_view input_local;
  
  values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)input._M_len;
  iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"none");
  if (iVar3 == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector(__return_storage_ptr__);
  }
  else {
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
              ((vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&count);
    do {
      value.m_value = 0.0;
      value.m_units = None;
      value._5_3_ = 0;
      while( true ) {
        LVar1 = value;
        LVar4 = (Length)std::basic_string_view<char,_std::char_traits<char>_>::length
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &values.
                                    super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_81 = 0;
        if ((ulong)LVar1 < (ulong)LVar4) {
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &values.
                               super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)value);
          local_81 = 0;
          if (*pvVar5 != ',') {
            pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &values.
                                 super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)value
                               );
            bVar2 = IS_WS((int)*pvVar5);
            local_81 = bVar2 ^ 0xff;
          }
        }
        if ((local_81 & 1) == 0) break;
        value = (Length)((long)value + 1);
      }
      Length::Length(&local_48,0.0,None);
      input_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &values.
                             super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0,(size_type)value);
      bVar2 = Length::parse(&local_48,input_00,Forbid);
      if (!bVar2) {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
                  (__return_storage_ptr__);
        goto LAB_00131976;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)value);
      std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::push_back
                ((vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&count,&local_48);
      bVar2 = skipOptionalSpacesOrComma
                        ((string_view *)
                         &values.
                          super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    } while (bVar2);
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
              (__return_storage_ptr__,
               (vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&count);
LAB_00131976:
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::~vector
              ((vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&count);
  }
  return __return_storage_ptr__;
}

Assistant:

static LengthList parseDashArray(std::string_view input)
{
    if(input.compare("none") == 0)
        return LengthList();
    LengthList values;
    do {
        size_t count = 0;
        while(count < input.length() && input[count] != ',' && !IS_WS(input[count]))
            ++count;
        Length value(0, LengthUnits::None);
        if(!value.parse(input.substr(0, count), LengthNegativeMode::Forbid))
            return LengthList();
        input.remove_prefix(count);
        values.push_back(std::move(value));
    } while(skipOptionalSpacesOrComma(input));
    return values;
}